

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_crc32(uchar *data,size_t length)

{
  uint r;
  size_t length_local;
  uchar *data_local;
  
  r = 0xffffffff;
  data_local = data;
  for (length_local = length; 7 < length_local; length_local = length_local - 8) {
    r = lodepng_crc32_table7[(uint)*data_local ^ r & 0xff] ^
        lodepng_crc32_table6[(uint)data_local[1] ^ r >> 8 & 0xff] ^
        lodepng_crc32_table5[(uint)data_local[2] ^ r >> 0x10 & 0xff] ^
        lodepng_crc32_table4[(uint)data_local[3] ^ r >> 0x18] ^ lodepng_crc32_table3[data_local[4]]
        ^ lodepng_crc32_table2[data_local[5]] ^ lodepng_crc32_table1[data_local[6]] ^
        lodepng_crc32_table0[data_local[7]];
    data_local = data_local + 8;
  }
  while (length_local != 0) {
    r = lodepng_crc32_table0[(r ^ *data_local) & 0xff] ^ r >> 8;
    length_local = length_local - 1;
    data_local = data_local + 1;
  }
  return r ^ 0xffffffff;
}

Assistant:

unsigned lodepng_crc32(const unsigned char* data, size_t length) {
  /*Using the Slicing by Eight algorithm*/
  unsigned r = 0xffffffffu;
  while(length >= 8) {
    r = lodepng_crc32_table7[(data[0] ^ (r & 0xffu))] ^
        lodepng_crc32_table6[(data[1] ^ ((r >> 8) & 0xffu))] ^
        lodepng_crc32_table5[(data[2] ^ ((r >> 16) & 0xffu))] ^
        lodepng_crc32_table4[(data[3] ^ ((r >> 24) & 0xffu))] ^
        lodepng_crc32_table3[data[4]] ^
        lodepng_crc32_table2[data[5]] ^
        lodepng_crc32_table1[data[6]] ^
        lodepng_crc32_table0[data[7]];
    data += 8;
    length -= 8;
  }
  while(length--) {
    r = lodepng_crc32_table0[(r ^ *data++) & 0xffu] ^ (r >> 8);
  }
  return r ^ 0xffffffffu;
}